

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O3

void __thiscall
t_cpp_generator::print_const_value
          (t_cpp_generator *this,ostream *out,string *name,t_type *type,t_const_value *value)

{
  pointer pcVar1;
  long lVar2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  size_t __n;
  string name_00;
  string name_01;
  string name_02;
  string name_03;
  string name_04;
  string name_05;
  t_const_value *ptVar5;
  t_cpp_generator *ptVar6;
  char cVar7;
  int iVar8;
  t_const_value *ptVar9;
  ostream *poVar10;
  t_const_value *ptVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar13;
  long *plVar14;
  t_type *type_00;
  t_const_value *ptVar15;
  pointer pptVar16;
  bool bVar17;
  string v2;
  string val_1;
  _Alloc_hider in_stack_fffffffffffffe88;
  _Alloc_hider __s2;
  _Alloc_hider _Var18;
  size_t in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150;
  char local_140 [16];
  t_const_value *local_130;
  t_const_value *local_128;
  _Base_ptr local_120;
  t_cpp_generator *local_118;
  undefined1 *local_110 [2];
  undefined1 local_100 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  undefined1 local_e0 [16];
  undefined1 *local_d0 [2];
  undefined1 local_c0 [16];
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  ptVar9 = (t_const_value *)t_type::get_true_type(type);
  cVar7 = (**(code **)(*(long *)&(ptVar9->mapVal_)._M_t._M_impl + 0x28))(ptVar9);
  if (cVar7 == '\0') {
    cVar7 = (**(code **)(*(long *)&(ptVar9->mapVal_)._M_t._M_impl + 0x50))(ptVar9);
    if (cVar7 == '\0') {
      cVar7 = (**(code **)(*(long *)&(ptVar9->mapVal_)._M_t._M_impl + 0x58))(ptVar9);
      if ((cVar7 == '\0') &&
         (cVar7 = (**(code **)(*(long *)&(ptVar9->mapVal_)._M_t._M_impl + 0x60))(ptVar9),
         cVar7 == '\0')) {
        cVar7 = (**(code **)(*(long *)&(ptVar9->mapVal_)._M_t._M_impl + 0x80))(ptVar9);
        if (cVar7 == '\0') {
          cVar7 = (**(code **)(*(long *)&(ptVar9->mapVal_)._M_t._M_impl + 0x70))(ptVar9);
          local_130 = value;
          if (cVar7 == '\0') {
            cVar7 = (**(code **)(*(long *)&(ptVar9->mapVal_)._M_t._M_impl + 0x78))();
            if (cVar7 == '\0') {
              pbVar12 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        __cxa_allocate_exception(0x20);
              pbVar13 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (**(code **)(*(long *)&(ptVar9->mapVal_)._M_t._M_impl + 0x18))(ptVar9);
              std::operator+(pbVar12,"INVALID TYPE IN print_const_value: ",pbVar13);
              __cxa_throw(pbVar12,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
            }
            pptVar16 = (value->listVal_).
                       super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>._M_impl
                       .super__Vector_impl_data._M_start;
            if (pptVar16 !=
                (value->listVal_).
                super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              ptVar9 = *(t_const_value **)
                        &ptVar9[1].mapVal_._M_t._M_impl.super__Rb_tree_header._M_header;
              do {
                pcVar1 = (name->_M_dataplus)._M_p;
                local_f0._M_allocated_capacity = (size_type)local_e0;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_f0,pcVar1,pcVar1 + name->_M_string_length);
                name_05._M_string_length = in_stack_fffffffffffffe90;
                name_05._M_dataplus._M_p = in_stack_fffffffffffffe88._M_p;
                name_05.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffffe98;
                name_05.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffffe9c;
                name_05.field_2._8_4_ = in_stack_fffffffffffffea0;
                name_05.field_2._12_4_ = in_stack_fffffffffffffea4;
                render_const_value((string *)&stack0xfffffffffffffe88,this,out,name_05,type,ptVar9);
                if ((undefined1 *)local_f0._M_allocated_capacity != local_e0) {
                  operator_delete((void *)local_f0._M_allocated_capacity);
                }
                poVar10 = t_generator::indent((t_generator *)this,out);
                type = (t_type *)name;
                poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar10,(name->_M_dataplus)._M_p,name->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar10,".insert(",8);
                poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar10,in_stack_fffffffffffffe88._M_p,
                                     in_stack_fffffffffffffe90);
                std::__ostream_insert<char,std::char_traits<char>>(poVar10,");",2);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,
                           ::endl_abi_cxx11_._M_string_length);
                if (in_stack_fffffffffffffe88._M_p != &stack0xfffffffffffffe98) {
                  operator_delete(in_stack_fffffffffffffe88._M_p);
                }
                pptVar16 = pptVar16 + 1;
              } while (pptVar16 !=
                       (local_130->listVal_).
                       super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>._M_impl
                       .super__Vector_impl_data._M_finish);
            }
          }
          else {
            pptVar16 = (value->listVal_).
                       super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>._M_impl
                       .super__Vector_impl_data._M_start;
            if (pptVar16 !=
                (value->listVal_).
                super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              ptVar9 = *(t_const_value **)
                        &ptVar9[1].mapVal_._M_t._M_impl.super__Rb_tree_header._M_header;
              do {
                pcVar1 = (name->_M_dataplus)._M_p;
                local_d0[0] = local_c0;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_d0,pcVar1,pcVar1 + name->_M_string_length);
                name_04._M_string_length = in_stack_fffffffffffffe90;
                name_04._M_dataplus._M_p = in_stack_fffffffffffffe88._M_p;
                name_04.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffffe98;
                name_04.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffffe9c;
                name_04.field_2._8_4_ = in_stack_fffffffffffffea0;
                name_04.field_2._12_4_ = in_stack_fffffffffffffea4;
                render_const_value((string *)&stack0xfffffffffffffe88,this,out,name_04,type,ptVar9);
                if (local_d0[0] != local_c0) {
                  operator_delete(local_d0[0]);
                }
                poVar10 = t_generator::indent((t_generator *)this,out);
                type = (t_type *)name;
                poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar10,(name->_M_dataplus)._M_p,name->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar10,".push_back(",0xb);
                poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar10,in_stack_fffffffffffffe88._M_p,
                                     in_stack_fffffffffffffe90);
                std::__ostream_insert<char,std::char_traits<char>>(poVar10,");",2);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,
                           ::endl_abi_cxx11_._M_string_length);
                if (in_stack_fffffffffffffe88._M_p != &stack0xfffffffffffffe98) {
                  operator_delete(in_stack_fffffffffffffe88._M_p);
                }
                pptVar16 = pptVar16 + 1;
              } while (pptVar16 !=
                       (local_130->listVal_).
                       super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>._M_impl
                       .super__Vector_impl_data._M_finish);
            }
          }
        }
        else {
          ptVar11 = (t_const_value *)
                    (value->mapVal_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          local_130 = (t_const_value *)&(value->mapVal_)._M_t._M_impl.super__Rb_tree_header;
          if (ptVar11 != local_130) {
            ptVar15 = *(t_const_value **)
                       &ptVar9[1].mapVal_._M_t._M_impl.super__Rb_tree_header._M_header;
            ptVar9 = (t_const_value *)
                     ptVar9[1].mapVal_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
            local_128 = ptVar15;
            do {
              pcVar1 = (name->_M_dataplus)._M_p;
              local_b0[0] = local_a0;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_b0,pcVar1,pcVar1 + name->_M_string_length);
              name_02._M_string_length = in_stack_fffffffffffffe90;
              name_02._M_dataplus._M_p = in_stack_fffffffffffffe88._M_p;
              name_02.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffffe98;
              name_02.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffffe9c;
              name_02.field_2._8_4_ = in_stack_fffffffffffffea0;
              name_02.field_2._12_4_ = in_stack_fffffffffffffea4;
              render_const_value((string *)&stack0xfffffffffffffe88,this,out,name_02,
                                 (t_type *)ptVar15,local_128);
              if (local_b0[0] != local_a0) {
                operator_delete(local_b0[0]);
              }
              local_110[0] = local_100;
              pcVar1 = (name->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_110,pcVar1,pcVar1 + name->_M_string_length);
              name_03._M_string_length = in_stack_fffffffffffffe90;
              name_03._M_dataplus._M_p = in_stack_fffffffffffffe88._M_p;
              name_03.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffffe98;
              name_03.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffffe9c;
              name_03.field_2._8_4_ = in_stack_fffffffffffffea0;
              name_03.field_2._12_4_ = in_stack_fffffffffffffea4;
              render_const_value((string *)&local_150,this,out,name_03,(t_type *)ptVar15,ptVar9);
              if (local_110[0] != local_100) {
                operator_delete(local_110[0]);
              }
              poVar10 = t_generator::indent((t_generator *)this,out);
              ptVar15 = (t_const_value *)name;
              poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar10,(name->_M_dataplus)._M_p,name->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,".insert(std::make_pair(",0x17);
              poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar10,in_stack_fffffffffffffe88._M_p,in_stack_fffffffffffffe90)
              ;
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,", ",2);
              poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar10,(char *)local_150._M_allocated_capacity,local_150._8_8_);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,"));",3);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,
                         ::endl_abi_cxx11_._M_string_length);
              if ((char *)local_150._M_allocated_capacity != local_140) {
                operator_delete((void *)local_150._M_allocated_capacity);
              }
              if (in_stack_fffffffffffffe88._M_p != &stack0xfffffffffffffe98) {
                operator_delete(in_stack_fffffffffffffe88._M_p);
              }
              ptVar11 = (t_const_value *)std::_Rb_tree_increment((_Rb_tree_node_base *)ptVar11);
            } while (ptVar11 != local_130);
          }
        }
      }
      else {
        ptVar11 = (t_const_value *)
                  (value->mapVal_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        ptVar15 = (t_const_value *)&(value->mapVal_)._M_t._M_impl.super__Rb_tree_header;
        p_Var3 = (_Base_ptr)out;
        ptVar6 = this;
        if (ptVar11 != ptVar15) {
          do {
            local_118 = ptVar6;
            local_120 = p_Var3;
            local_130 = ptVar15;
            plVar14 = *(long **)&(ptVar9->identifierVal_).field_2;
            if (plVar14 == *(long **)((long)&(ptVar9->identifierVal_).field_2 + 8)) {
LAB_00180083:
              pbVar12 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        __cxa_allocate_exception(0x20);
              pbVar13 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (**(code **)(*(long *)&(ptVar9->mapVal_)._M_t._M_impl + 0x18))(ptVar9);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_150,"type error: ",pbVar13);
              plVar14 = (long *)std::__cxx11::string::append(local_150._M_local_buf);
              *plVar14 = (long)(plVar14 + 2);
              plVar14[1] = 0;
              *(undefined1 *)(plVar14 + 2) = 0;
              p_Var3 = (ptVar11->mapVal_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
              local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
              p_Var4 = p_Var3[2]._M_parent;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_70,p_Var4,
                         (long)&p_Var4->_M_color + (long)&(p_Var3[2]._M_left)->_M_color);
              std::operator+(pbVar12,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&stack0xfffffffffffffe88,&local_70);
              __cxa_throw(pbVar12,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
            }
            local_128 = (t_const_value *)0x0;
            ptVar15 = (t_const_value *)0x0;
            do {
              lVar2 = *plVar14;
              p_Var3 = (ptVar11->mapVal_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
              type_00 = (t_type *)&stack0xfffffffffffffe98;
              p_Var4 = p_Var3[2]._M_parent;
              __s2._M_p = (pointer)type_00;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&stack0xfffffffffffffe88,p_Var4,
                         (long)&p_Var4->_M_color + (long)&(p_Var3[2]._M_left)->_M_color);
              __n = *(size_t *)(lVar2 + 0x70);
              _Var18._M_p = __s2._M_p;
              if (__n == in_stack_fffffffffffffe90) {
                if (__n == 0) {
                  bVar17 = true;
                }
                else {
                  iVar8 = bcmp(*(void **)(lVar2 + 0x68),__s2._M_p,__n);
                  bVar17 = iVar8 == 0;
                }
              }
              else {
                bVar17 = false;
              }
              if ((t_type *)__s2._M_p != (t_type *)&stack0xfffffffffffffe98) {
                operator_delete(__s2._M_p);
              }
              if (bVar17) {
                lVar2 = *plVar14;
                ptVar15 = *(t_const_value **)(lVar2 + 0x60);
                local_128 = (t_const_value *)
                            CONCAT71((int7)((ulong)lVar2 >> 8),*(int *)(lVar2 + 0x8c) != 0);
              }
              plVar14 = plVar14 + 1;
            } while (plVar14 != *(long **)((long)&(ptVar9->identifierVal_).field_2 + 8));
            if (ptVar15 == (t_const_value *)0x0) goto LAB_00180083;
            pcVar1 = (name->_M_dataplus)._M_p;
            local_90[0] = local_80;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_90,pcVar1,pcVar1 + name->_M_string_length);
            ptVar6 = local_118;
            out = (ostream *)local_120;
            name_01._M_string_length = in_stack_fffffffffffffe90;
            name_01._M_dataplus._M_p = _Var18._M_p;
            name_01.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffffe98;
            name_01.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffffe9c;
            name_01.field_2._8_4_ = in_stack_fffffffffffffea0;
            name_01.field_2._12_4_ = in_stack_fffffffffffffea4;
            render_const_value((string *)&stack0xfffffffffffffe88,local_118,(ostream *)local_120,
                               name_01,type_00,ptVar15);
            ptVar5 = local_130;
            if (local_90[0] != local_80) {
              operator_delete(local_90[0]);
            }
            poVar10 = t_generator::indent((t_generator *)ptVar6,out);
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar10,(name->_M_dataplus)._M_p,name->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,".",1);
            p_Var3 = (ptVar11->mapVal_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
            local_150._M_allocated_capacity = (size_type)local_140;
            p_Var4 = p_Var3[2]._M_parent;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_150,p_Var4,
                       (long)&p_Var4->_M_color + (long)&(p_Var3[2]._M_left)->_M_color);
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar10,(char *)local_150._M_allocated_capacity,local_150._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10," = ",3);
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar10,_Var18._M_p,in_stack_fffffffffffffe90);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,";",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                      );
            if ((char *)local_150._M_allocated_capacity != local_140) {
              operator_delete((void *)local_150._M_allocated_capacity);
            }
            if (((ulong)local_128 & 1) != 0) {
              poVar10 = t_generator::indent((t_generator *)ptVar6,out);
              poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar10,(name->_M_dataplus)._M_p,name->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,".__isset.",9);
              p_Var3 = (ptVar11->mapVal_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
              local_150._M_allocated_capacity = (size_type)local_140;
              p_Var4 = p_Var3[2]._M_parent;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_150,p_Var4,
                         (long)&p_Var4->_M_color + (long)&(p_Var3[2]._M_left)->_M_color);
              poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar10,(char *)local_150._M_allocated_capacity,local_150._8_8_);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10," = true;",8);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,
                         ::endl_abi_cxx11_._M_string_length);
              if ((char *)local_150._M_allocated_capacity != local_140) {
                operator_delete((void *)local_150._M_allocated_capacity);
              }
            }
            if ((t_type *)_Var18._M_p != (t_type *)&stack0xfffffffffffffe98) {
              operator_delete(_Var18._M_p);
            }
            ptVar11 = (t_const_value *)std::_Rb_tree_increment((_Rb_tree_node_base *)ptVar11);
            ptVar15 = local_130;
            p_Var3 = local_120;
            ptVar6 = local_118;
          } while (ptVar11 != ptVar5);
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      return;
    }
    poVar10 = t_generator::indent((t_generator *)this,out);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,(name->_M_dataplus)._M_p,name->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," = (",4);
    type_name_abi_cxx11_((string *)&stack0xfffffffffffffe88,this,(t_type *)ptVar9,false,false);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,in_stack_fffffffffffffe88._M_p,in_stack_fffffffffffffe90);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,")",1);
    t_const_value::get_integer(value);
    poVar10 = std::ostream::_M_insert<long>((long)poVar10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,";",1);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,
                         ::endl_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  }
  else {
    pcVar1 = (name->_M_dataplus)._M_p;
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_50,pcVar1,pcVar1 + name->_M_string_length);
    name_00._M_string_length = in_stack_fffffffffffffe90;
    name_00._M_dataplus._M_p = in_stack_fffffffffffffe88._M_p;
    name_00.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffffe98;
    name_00.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffffe9c;
    name_00.field_2._8_4_ = in_stack_fffffffffffffea0;
    name_00.field_2._12_4_ = in_stack_fffffffffffffea4;
    render_const_value((string *)&stack0xfffffffffffffe88,this,out,name_00,type,ptVar9);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
    poVar10 = t_generator::indent((t_generator *)this,out);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,(name->_M_dataplus)._M_p,name->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," = ",3);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,in_stack_fffffffffffffe88._M_p,in_stack_fffffffffffffe90);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,";",1);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,
                         ::endl_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  }
  if (in_stack_fffffffffffffe88._M_p != &stack0xfffffffffffffe98) {
    operator_delete(in_stack_fffffffffffffe88._M_p);
  }
  return;
}

Assistant:

void t_cpp_generator::print_const_value(ostream& out,
                                        string name,
                                        t_type* type,
                                        t_const_value* value) {
  type = get_true_type(type);
  if (type->is_base_type()) {
    string v2 = render_const_value(out, name, type, value);
    indent(out) << name << " = " << v2 << ";" << endl << endl;
  } else if (type->is_enum()) {
    indent(out) << name << " = (" << type_name(type) << ")" << value->get_integer() << ";" << endl
                << endl;
  } else if (type->is_struct() || type->is_xception()) {
    const vector<t_field*>& fields = ((t_struct*)type)->get_members();
    vector<t_field*>::const_iterator f_iter;
    const map<t_const_value*, t_const_value*, t_const_value::value_compare>& val = value->get_map();
    map<t_const_value*, t_const_value*, t_const_value::value_compare>::const_iterator v_iter;
    bool is_nonrequired_field = false;
    for (v_iter = val.begin(); v_iter != val.end(); ++v_iter) {
      t_type* field_type = nullptr;
      is_nonrequired_field = false;
      for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
        if ((*f_iter)->get_name() == v_iter->first->get_string()) {
          field_type = (*f_iter)->get_type();
          is_nonrequired_field = (*f_iter)->get_req() != t_field::T_REQUIRED;
        }
      }
      if (field_type == nullptr) {
        throw "type error: " + type->get_name() + " has no field " + v_iter->first->get_string();
      }
      string val = render_const_value(out, name, field_type, v_iter->second);
      indent(out) << name << "." << v_iter->first->get_string() << " = " << val << ";" << endl;
      if (is_nonrequired_field) {
        indent(out) << name << ".__isset." << v_iter->first->get_string() << " = true;" << endl;
      }
    }
    out << endl;
  } else if (type->is_map()) {
    t_type* ktype = ((t_map*)type)->get_key_type();
    t_type* vtype = ((t_map*)type)->get_val_type();
    const map<t_const_value*, t_const_value*, t_const_value::value_compare>& val = value->get_map();
    map<t_const_value*, t_const_value*, t_const_value::value_compare>::const_iterator v_iter;
    for (v_iter = val.begin(); v_iter != val.end(); ++v_iter) {
      string key = render_const_value(out, name, ktype, v_iter->first);
      string val = render_const_value(out, name, vtype, v_iter->second);
      indent(out) << name << ".insert(std::make_pair(" << key << ", " << val << "));" << endl;
    }
    out << endl;
  } else if (type->is_list()) {
    t_type* etype = ((t_list*)type)->get_elem_type();
    const vector<t_const_value*>& val = value->get_list();
    vector<t_const_value*>::const_iterator v_iter;
    for (v_iter = val.begin(); v_iter != val.end(); ++v_iter) {
      string val = render_const_value(out, name, etype, *v_iter);
      indent(out) << name << ".push_back(" << val << ");" << endl;
    }
    out << endl;
  } else if (type->is_set()) {
    t_type* etype = ((t_set*)type)->get_elem_type();
    const vector<t_const_value*>& val = value->get_list();
    vector<t_const_value*>::const_iterator v_iter;
    for (v_iter = val.begin(); v_iter != val.end(); ++v_iter) {
      string val = render_const_value(out, name, etype, *v_iter);
      indent(out) << name << ".insert(" << val << ");" << endl;
    }
    out << endl;
  } else {
    throw "INVALID TYPE IN print_const_value: " + type->get_name();
  }
}